

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRSearchPath.h
# Opt level: O0

string * __thiscall
MinVR::VRSearchPlugin::_selectFile(VRSearchPlugin *this,string *file,string *directory)

{
  char *pcVar1;
  string *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string dir_with_slash;
  string buildType;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  allocator<char> *__a;
  char *in_stack_ffffffffffffff08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  allocator<char> local_41;
  string local_40 [32];
  string *local_20;
  
  __a = &local_41;
  __lhs = in_RDI;
  local_20 = in_RCX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,__a);
  std::allocator<char>::~allocator(&local_41);
  std::__cxx11::string::string((string *)&local_78,local_20);
  std::__cxx11::string::length();
  pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)&local_78);
  if (*pcVar1 == '/') {
    in_stack_fffffffffffffed0 = &local_78;
    std::__cxx11::string::length();
    in_stack_fffffffffffffed8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::__cxx11::string::operator[]((ulong)in_stack_fffffffffffffed0);
    if (in_stack_fffffffffffffed8->_M_dataplus == (_Alloc_hider)0x5c) goto LAB_00136b1f;
  }
  std::operator+(__lhs,(char *)in_RDI);
  std::__cxx11::string::operator=((string *)&local_78,local_98);
  std::__cxx11::string::~string(local_98);
LAB_00136b1f:
  std::operator+(__lhs,(char *)in_RDI);
  std::operator+(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  std::operator+(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  std::operator+(in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string(local_d8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff08);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string(local_40);
  return __lhs;
}

Assistant:

std::string _selectFile(const std::string &file,
                          const std::string &directory) const {

    std::string buildType = "";
#ifdef MinVR_DEBUG
    buildType = "d";
#endif

    std::string dir_with_slash = directory;
    if ((dir_with_slash[dir_with_slash.length() - 1] != '/') || (dir_with_slash[dir_with_slash.length() - 1] != '\\')) {
        dir_with_slash = dir_with_slash + "/";
    }


#if defined(WIN32)
    return dir_with_slash + file + buildType + ".dll";

#elif defined(__APPLE__)
    return dir_with_slash + "lib" + file + buildType + ".dylib";

#else // Linux
    return dir_with_slash + "lib" + file + buildType + ".so";

#endif
  }